

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

void embree::emitXML(FileName *fileName,Ref<embree::XML> *xml)

{
  byte bVar1;
  char *pcVar2;
  runtime_error *this;
  ofstream cout;
  char *__rhs;
  undefined6 in_stack_fffffffffffffd78;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  string local_240 [24];
  size_t in_stack_fffffffffffffdd8;
  Ref<embree::XML> *in_stack_fffffffffffffde0;
  ostream *in_stack_fffffffffffffde8;
  char local_210 [528];
  
  pcVar2 = FileName::c_str((FileName *)0x416914);
  __rhs = local_210;
  std::ofstream::ofstream(__rhs,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar3 = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    FileName::str_abi_cxx11_((FileName *)this);
    std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,CONCAT16(bVar1,in_stack_fffffffffffffd78)),__rhs);
    std::runtime_error::runtime_error(this,local_240);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  emitXML(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void emitXML(const FileName& fileName, const Ref<XML>& xml)
  {
    std::ofstream cout(fileName.c_str());
    if (!cout.is_open()) THROW_RUNTIME_ERROR("cannot open file " + fileName.str() + " for writing");
    emitXML(cout,xml);
    cout.close();
  }